

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O2

int __thiscall
ncnn::LSTM::forward(LSTM *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  void *__src;
  pointer pMVar10;
  int iVar11;
  void *in_R8;
  void *__dest;
  ulong uVar12;
  bool bVar13;
  Mat m;
  Mat local_318;
  Mat local_2c8;
  ulong local_280;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_278;
  Mat m_2;
  Mat m_1;
  Mat m_5;
  Mat m_4;
  Mat m_3;
  Mat local_108;
  Mat m_8;
  Mat m_7;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_280 = (ulong)(uint)bottom_blob->h;
  iVar4 = this->direction;
  local_2c8.cstep = 0;
  local_2c8.data = (void *)0x0;
  local_2c8.refcount._0_4_ = 0;
  local_2c8.refcount._4_4_ = 0;
  local_2c8.elemsize._0_4_ = 0;
  local_2c8.elemsize._4_4_ = 0;
  local_2c8.elempack = 0;
  local_2c8.allocator = (Allocator *)0x0;
  local_2c8.dims = 0;
  local_2c8.w = 0;
  local_2c8.h = 0;
  local_2c8.d = 0;
  local_2c8.c = 0;
  local_318.cstep = 0;
  local_318.data = (void *)0x0;
  local_318.refcount._0_4_ = 0;
  local_318.refcount._4_4_ = 0;
  local_318.elemsize._0_4_ = 0;
  local_318.elemsize._4_4_ = 0;
  local_318.elempack = 0;
  local_318.allocator = (Allocator *)0x0;
  local_318.dims = 0;
  local_318.w = 0;
  local_318.h = 0;
  local_318.d = 0;
  local_318.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0xd8];
  local_278 = top_blobs;
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0xd8) {
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,0xd8,in_R8);
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    iVar11 = (int)local_280;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_2c8.allocator == (Allocator *)0x0) {
          free(local_2c8.data);
        }
        else {
          (*(local_2c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_2c8.data = m.data;
    local_2c8.refcount._0_4_ = m.refcount._0_4_;
    local_2c8.refcount._4_4_ = m.refcount._4_4_;
    local_2c8.elemsize._0_4_ = (undefined4)m.elemsize;
    local_2c8.elemsize._4_4_ = m.elemsize._4_4_;
    local_2c8.elempack = m.elempack;
    local_2c8.allocator = m.allocator;
    local_2c8.dims = m.dims;
    local_2c8.w = m.w;
    local_2c8.h = m.h;
    uVar2._0_4_ = m.d;
    uVar2._4_4_ = m.c;
    local_2c8.d = m.d;
    local_2c8.c = m.c;
    local_2c8.cstep = m.cstep;
    sVar6 = m.cstep;
    uVar3 = uVar2;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      uVar3 = local_2c8._52_8_;
      if (*piVar1 == 0) {
        local_2c8._52_8_ = uVar2;
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
          uVar3 = local_2c8._52_8_;
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
          uVar3 = local_2c8._52_8_;
        }
      }
    }
    local_2c8._52_8_ = uVar3;
    Mat::clone(&m,(__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar6,
               in_R8);
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_318.allocator == (Allocator *)0x0) {
          free(local_318.data);
        }
        else {
          (*(local_318.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_318.data = m.data;
    local_318.refcount._0_4_ = m.refcount._0_4_;
    local_318.refcount._4_4_ = m.refcount._4_4_;
    local_318.elemsize._0_4_ = (undefined4)m.elemsize;
    local_318.elemsize._4_4_ = m.elemsize._4_4_;
    local_318.elempack = m.elempack;
    local_318.allocator = m.allocator;
    local_318.dims = m.dims;
    local_318.w = m.w;
    local_318.h = m.h;
    local_318.d = m.d;
    local_318.c = m.c;
    local_318.cstep = m.cstep;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
LAB_003577e0:
    this_00 = (local_278->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_00,this->num_output << (iVar4 == 2),iVar11,4,opt->blob_allocator);
    iVar4 = -100;
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      uVar5 = this->direction;
      if (uVar5 < 2) {
        m.w = (this->weight_xc_data).w;
        m.h = (this->weight_xc_data).h;
        m.data = (this->weight_xc_data).data;
        uVar12 = (this->weight_xc_data).elemsize;
        m.elempack = (this->weight_xc_data).elempack;
        m.allocator = (this->weight_xc_data).allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (undefined4)uVar12;
        m.elemsize._4_4_ = (undefined4)(uVar12 >> 0x20);
        m.c = (this->weight_xc_data).d;
        m.d = 1;
        iVar4 = (this->weight_xc_data).dims;
        m.dims = iVar4 + -1;
        m.cstep = (uVar12 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar12;
        if (iVar4 == 4) {
          m.cstep = (long)m.h * (long)m.w;
        }
        m_1.w = (this->bias_c_data).w;
        m_1.h = (this->bias_c_data).h;
        m_1.data = (this->bias_c_data).data;
        uVar12 = (this->bias_c_data).elemsize;
        m_1.elempack = (this->bias_c_data).elempack;
        m_1.allocator = (this->bias_c_data).allocator;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = (undefined4)uVar12;
        m_1.elemsize._4_4_ = (undefined4)(uVar12 >> 0x20);
        m_1.c = (this->bias_c_data).d;
        m_1.d = 1;
        iVar4 = (this->bias_c_data).dims;
        m_1.dims = iVar4 + -1;
        m_1.cstep = (uVar12 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar12;
        if (iVar4 == 4) {
          m_1.cstep = (long)m_1.h * (long)m_1.w;
        }
        m_2.w = (this->weight_hc_data).w;
        m_2.h = (this->weight_hc_data).h;
        m_2.c = (this->weight_hc_data).d;
        m_2.data = (this->weight_hc_data).data;
        m_2.elemsize = (this->weight_hc_data).elemsize;
        m_2.elempack = (this->weight_hc_data).elempack;
        m_2.allocator = (this->weight_hc_data).allocator;
        m_2.refcount = (int *)0x0;
        m_2.d = 1;
        sVar6 = (long)m_2.h * (long)m_2.w;
        iVar4 = (this->weight_hc_data).dims;
        m_2.dims = iVar4 + -1;
        m_2.cstep = (m_2.elemsize * sVar6 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
        if (iVar4 == 4) {
          m_2.cstep = sVar6;
        }
        iVar4 = lstm(bottom_blob,this_00,uVar5,&m,&m_1,&m_2,&local_2c8,&local_318,opt);
        if (iVar4 != 0) goto LAB_003584fb;
        uVar5 = this->direction;
      }
      if (uVar5 == 2) {
        m.cstep = 0;
        m.data = (void *)0x0;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = 0;
        m.elemsize._4_4_ = 0;
        m.elempack = 0;
        m.allocator = (Allocator *)0x0;
        m.dims = 0;
        m.w = 0;
        m.h = 0;
        m.d = 0;
        m.c = 0;
        Mat::create(&m,this->num_output,iVar11,4,opt->workspace_allocator);
        iVar4 = -100;
        if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
          bVar13 = false;
        }
        else {
          m_1.cstep = 0;
          m_1.data = (void *)0x0;
          m_1.refcount._0_4_ = 0;
          m_1.refcount._4_4_ = 0;
          m_1.elemsize._0_4_ = 0;
          m_1.elemsize._4_4_ = 0;
          m_1.elempack = 0;
          m_1.allocator = (Allocator *)0x0;
          m_1.dims = 0;
          m_1.w = 0;
          m_1.h = 0;
          m_1.d = 0;
          m_1.c = 0;
          Mat::create(&m_1,this->num_output,iVar11,4,opt->workspace_allocator);
          iVar4 = -100;
          if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
            bVar13 = false;
          }
          else {
            m_2.cstep = (size_t)local_2c8.w;
            m_2.elemsize = CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize);
            m_2.data = local_2c8.data;
            m_2.refcount = (int *)0x0;
            m_2.elempack = local_2c8.elempack;
            m_2.allocator = local_2c8.allocator;
            iVar11 = 2;
            m_2.w = local_2c8.w;
            m_2.h = 1;
            m_2.d = 1;
            iVar9 = 1;
            local_108.cstep = (size_t)local_318.w;
            local_108.elemsize = CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize);
            local_108.data = local_318.data;
            local_108.refcount = (int *)0x0;
            local_108.elempack = local_318.elempack;
            local_108.allocator = local_318.allocator;
            local_108.w = local_318.w;
            local_108.h = 1;
            local_108.d = 1;
            m_3.w = (this->weight_xc_data).w;
            m_3.h = (this->weight_xc_data).h;
            m_3.c = (this->weight_xc_data).d;
            m_3.data = (this->weight_xc_data).data;
            m_3.elemsize = (this->weight_xc_data).elemsize;
            m_3.elempack = (this->weight_xc_data).elempack;
            m_3.allocator = (this->weight_xc_data).allocator;
            m_3.refcount = (int *)0x0;
            m_3.d = 1;
            sVar6 = (long)m_3.h * (long)m_3.w;
            iVar4 = (this->weight_xc_data).dims;
            m_3.dims = iVar4 + -1;
            m_3.cstep = (m_3.elemsize * sVar6 + 0xf & 0xfffffffffffffff0) / m_3.elemsize;
            if (iVar4 == 4) {
              m_3.cstep = sVar6;
            }
            m_4.w = (this->bias_c_data).w;
            m_4.h = (this->bias_c_data).h;
            m_4.c = (this->bias_c_data).d;
            m_4.data = (this->bias_c_data).data;
            m_4.elemsize = (this->bias_c_data).elemsize;
            m_4.elempack = (this->bias_c_data).elempack;
            m_4.allocator = (this->bias_c_data).allocator;
            m_4.refcount = (int *)0x0;
            m_4.d = 1;
            sVar6 = (long)m_4.h * (long)m_4.w;
            iVar4 = (this->bias_c_data).dims;
            m_4.dims = iVar4 + -1;
            m_4.cstep = (m_4.elemsize * sVar6 + 0xf & 0xfffffffffffffff0) / m_4.elemsize;
            if (iVar4 == 4) {
              m_4.cstep = sVar6;
            }
            m_5.w = (this->weight_hc_data).w;
            m_5.h = (this->weight_hc_data).h;
            m_5.c = (this->weight_hc_data).d;
            m_5.data = (this->weight_hc_data).data;
            m_5.elemsize = (this->weight_hc_data).elemsize;
            m_5.elempack = (this->weight_hc_data).elempack;
            m_5.allocator = (this->weight_hc_data).allocator;
            m_5.refcount = (int *)0x0;
            m_5.d = 1;
            iVar4 = (this->weight_hc_data).dims;
            m_5.dims = iVar4 + -1;
            m_5.cstep = (m_5.elemsize * (long)m_5.h * (long)m_5.w + 0xf & 0xfffffffffffffff0) /
                        m_5.elemsize;
            if (iVar4 == 4) {
              m_5.cstep = (long)m_5.h * (long)m_5.w;
            }
            m_2.dims = iVar11;
            m_2.c = iVar9;
            local_108.dims = iVar11;
            local_108.c = iVar9;
            iVar4 = lstm(bottom_blob,&m,0,&m_3,&m_4,&m_5,&m_2,&local_108,opt);
            uVar12 = local_280;
            if (iVar4 == 0) {
              m_3.cstep = (size_t)local_2c8.w;
              m_3.elemsize = CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize);
              m_3.data = (void *)(m_3.elemsize * m_3.cstep + (long)local_2c8.data);
              m_3.refcount = (int *)0x0;
              m_3.elempack = local_2c8.elempack;
              m_3.allocator = local_2c8.allocator;
              m_3.w = local_2c8.w;
              m_3.h = 1;
              m_3.d = 1;
              m_4.cstep = (size_t)local_318.w;
              m_4.elemsize = CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize);
              m_4.data = (void *)(m_4.elemsize * m_4.cstep + (long)local_318.data);
              m_4.refcount = (int *)0x0;
              m_4.elempack = local_318.elempack;
              m_4.allocator = local_318.allocator;
              m_4.w = local_318.w;
              m_4.h = 1;
              m_4.d = 1;
              m_5.w = (this->weight_xc_data).w;
              m_5.h = (this->weight_xc_data).h;
              m_5.elemsize = (this->weight_xc_data).elemsize;
              m_5.data = (void *)((this->weight_xc_data).cstep * m_5.elemsize +
                                 (long)(this->weight_xc_data).data);
              m_5.c = (this->weight_xc_data).d;
              m_5.elempack = (this->weight_xc_data).elempack;
              m_5.allocator = (this->weight_xc_data).allocator;
              m_5.refcount = (int *)0x0;
              iVar4 = (this->weight_xc_data).dims;
              m_5.dims = iVar4 + -1;
              m_5.cstep = (m_5.elemsize * (long)m_5.h * (long)m_5.w + 0xf & 0xfffffffffffffff0) /
                          m_5.elemsize;
              if (iVar4 == 4) {
                m_5.cstep = (long)m_5.h * (long)m_5.w;
              }
              m_7.w = (this->bias_c_data).w;
              m_7.h = (this->bias_c_data).h;
              m_7.elemsize = (this->bias_c_data).elemsize;
              m_7.data = (void *)((this->bias_c_data).cstep * m_7.elemsize +
                                 (long)(this->bias_c_data).data);
              m_7.c = (this->bias_c_data).d;
              m_7.elempack = (this->bias_c_data).elempack;
              m_7.allocator = (this->bias_c_data).allocator;
              m_7.refcount = (int *)0x0;
              m_7.d = 1;
              iVar4 = (this->bias_c_data).dims;
              m_7.dims = iVar4 + -1;
              m_7.cstep = (m_7.elemsize * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) /
                          m_7.elemsize;
              if (iVar4 == 4) {
                m_7.cstep = (long)m_7.h * (long)m_7.w;
              }
              m_8.w = (this->weight_hc_data).w;
              m_8.h = (this->weight_hc_data).h;
              m_8.elemsize = (this->weight_hc_data).elemsize;
              m_8.data = (void *)((this->weight_hc_data).cstep * m_8.elemsize +
                                 (long)(this->weight_hc_data).data);
              m_8.c = (this->weight_hc_data).d;
              m_8.elempack = (this->weight_hc_data).elempack;
              m_8.allocator = (this->weight_hc_data).allocator;
              m_8.refcount = (int *)0x0;
              m_8.d = 1;
              iVar4 = (this->weight_hc_data).dims;
              m_8.dims = iVar4 + -1;
              m_8.cstep = (m_8.elemsize * (long)m_8.h * (long)m_8.w + 0xf & 0xfffffffffffffff0) /
                          m_8.elemsize;
              if (iVar4 == 4) {
                m_8.cstep = (long)m_8.h * (long)m_8.w;
              }
              m_5.d = iVar9;
              m_4.dims = iVar11;
              m_4.c = iVar9;
              m_3.dims = iVar11;
              m_3.c = iVar9;
              iVar4 = lstm(bottom_blob,&m_1,1,&m_5,&m_7,&m_8,&m_3,&m_4,opt);
              bVar13 = iVar4 == 0;
              if (bVar13) {
                uVar7 = uVar12 & 0xffffffff;
                if ((int)uVar12 < 1) {
                  uVar7 = 0;
                }
                for (uVar12 = 0; iVar4 = 0, uVar7 != uVar12; uVar12 = uVar12 + 1) {
                  __src = (void *)((long)m_1.w * uVar12 *
                                   CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                  (long)m_1.data);
                  __dest = (void *)((long)this_00->w * uVar12 * this_00->elemsize +
                                   (long)this_00->data);
                  memcpy(__dest,(void *)((long)m.w * uVar12 *
                                         CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                        (long)m.data),(long)this->num_output << 2);
                  memcpy((void *)((long)__dest + (long)this->num_output * 4),__src,
                         (long)this->num_output << 2);
                }
              }
              if (local_108.refcount != (int *)0x0) {
                LOCK();
                *local_108.refcount = *local_108.refcount + -1;
                UNLOCK();
                if (*local_108.refcount == 0) {
                  if (local_108.allocator == (Allocator *)0x0) {
                    free(local_108.data);
                  }
                  else {
                    (*(local_108.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            else {
              bVar13 = false;
            }
            if (m_2.refcount != (int *)0x0) {
              LOCK();
              *m_2.refcount = *m_2.refcount + -1;
              UNLOCK();
              if (*m_2.refcount == 0) {
                if (m_2.allocator == (Allocator *)0x0) {
                  free(m_2.data);
                }
                else {
                  (*(m_2.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar1 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                free(m_1.data);
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              free(m.data);
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (!bVar13) goto LAB_003584fb;
      }
      pMVar10 = (local_278->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar4 = 0;
      if ((long)(local_278->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pMVar10 == 0xd8) {
        if (pMVar10 + 1 != &local_2c8) {
          piVar1 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          piVar1 = pMVar10[1].refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (pMVar10[1].allocator == (Allocator *)0x0) {
                free(pMVar10[1].data);
              }
              else {
                (*(pMVar10[1].allocator)->_vptr_Allocator[3])();
              }
            }
          }
          pMVar10[1].data = local_2c8.data;
          pMVar10[1].refcount = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
          pMVar10[1].elemsize = CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize);
          pMVar10[1].elempack = local_2c8.elempack;
          pMVar10[1].allocator = local_2c8.allocator;
          pMVar10[1].dims = local_2c8.dims;
          pMVar10[1].w = local_2c8.w;
          pMVar10[1].h = local_2c8.h;
          pMVar10[1].d = local_2c8.d;
          pMVar10[1].c = local_2c8.c;
          pMVar10[1].cstep = local_2c8.cstep;
          pMVar10 = (local_278->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        }
        if (pMVar10 + 2 != &local_318) {
          piVar1 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          piVar1 = pMVar10[2].refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (pMVar10[2].allocator == (Allocator *)0x0) {
                free(pMVar10[2].data);
              }
              else {
                (*(pMVar10[2].allocator)->_vptr_Allocator[3])();
              }
            }
          }
          pMVar10[2].data = local_318.data;
          pMVar10[2].refcount = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
          pMVar10[2].elemsize = CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize);
          pMVar10[2].elempack = local_318.elempack;
          pMVar10[2].allocator = local_318.allocator;
          pMVar10[2].dims = local_318.dims;
          pMVar10[2].w = local_318.w;
          pMVar10[2].h = local_318.h;
          pMVar10[2].d = local_318.d;
          pMVar10[2].c = local_318.c;
          pMVar10[2].cstep = local_318.cstep;
        }
      }
    }
  }
  else {
    iVar9 = (iVar4 == 2) + 1;
    Mat::create(&local_2c8,this->num_output,iVar9,4,_allocator);
    if ((local_2c8.data != (void *)0x0) && (local_2c8.cstep * (long)local_2c8.c != 0)) {
      uVar5 = (int)local_2c8.cstep * local_2c8.c;
      uVar7 = 0;
      uVar12 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar12 = uVar7;
      }
      for (; (int)uVar12 != (int)uVar7; uVar7 = uVar7 + 1) {
        *(undefined4 *)((long)local_2c8.data + uVar7 * 4) = 0;
      }
      Mat::create(&local_318,this->num_output,iVar9,4,_allocator);
      if ((local_318.data != (void *)0x0) && (local_318.cstep * (long)local_318.c != 0)) {
        iVar9 = (int)local_318.cstep * local_318.c;
        lVar8 = 0;
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        iVar11 = (int)local_280;
        for (; iVar9 != (int)lVar8; lVar8 = lVar8 + 1) {
          *(undefined4 *)((long)local_318.data + lVar8 * 4) = 0;
        }
        goto LAB_003577e0;
      }
    }
    iVar4 = -100;
  }
LAB_003584fb:
  piVar1 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_318.allocator == (Allocator *)0x0) {
        free(local_318.data);
      }
      else {
        (*(local_318.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar1 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_2c8.allocator == (Allocator *)0x0) {
        free(local_2c8.data);
      }
      else {
        (*(local_2c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar4;
}

Assistant:

int LSTM::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden0, cell0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden1, cell1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}